

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

size_t searchCodeIndex(uint *array,size_t array_size,size_t value)

{
  ulong uVar1;
  size_t mid;
  size_t right;
  size_t left;
  size_t value_local;
  size_t array_size_local;
  uint *array_local;
  
  left = 1;
  right = array_size - 1;
  while (left <= right) {
    uVar1 = left + right >> 1;
    if (array[uVar1] < value) {
      left = uVar1 + 1;
    }
    else {
      right = uVar1 - 1;
    }
  }
  if ((array_size <= left) || (value < array[left])) {
    left = left - 1;
  }
  return left;
}

Assistant:

static size_t searchCodeIndex(const unsigned* array, size_t array_size, size_t value)
{
  /*binary search (only small gain over linear). TODO: use CPU log2 instruction for getting symbols instead*/
  size_t left = 1;
  size_t right = array_size - 1;

  while(left <= right) {
    size_t mid = (left + right) >> 1;
    if (array[mid] >= value) right = mid - 1;
    else left = mid + 1;
  }
  if(left >= array_size || array[left] > value) left--;
  return left;
}